

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O0

int __thiscall QFile::link(QFile *this,char *__from,char *__to)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  QFilePrivate *pQVar4;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  QFilePrivate *d;
  QFileInfo fi;
  undefined4 in_stack_ffffffffffffff18;
  FileError in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  QMessageLogger *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  QFileInfo *in_stack_ffffffffffffff40;
  bool local_79;
  undefined1 local_60 [24];
  undefined1 *local_48;
  QMessageLogger local_40;
  undefined1 local_20 [24];
  long local_8;
  long *plVar5;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QFile *)0x2a5715);
  (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0x1d])(local_20);
  bVar1 = QString::isEmpty((QString *)0x2a573d);
  QString::~QString((QString *)0x2a574e);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff30,
               (char *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff24,
               (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QMessageLogger::warning(&local_40,"QFile::link: Empty or null file name");
    local_79 = false;
  }
  else {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo
              (in_stack_ffffffffffffff40,
               (QString *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    iVar3 = (*(pQVar4->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
              super_QObjectData._vptr_QObjectData[7])();
    plVar5 = (long *)CONCAT44(extraout_var,iVar3);
    QFileInfo::absoluteFilePath
              ((QFileInfo *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    bVar2 = (**(code **)(*plVar5 + 0x70))(plVar5,local_60);
    QString::~QString((QString *)0x2a5807);
    local_79 = (bVar2 & 1) != 0;
    if (local_79) {
      QFileDevice::unsetError
                ((QFileDevice *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    }
    else {
      std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
                ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                 0x2a5880);
      QAbstractFileEngine::errorString
                ((QAbstractFileEngine *)
                 CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      QFileDevicePrivate::setError
                ((QFileDevicePrivate *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                 ,in_stack_ffffffffffffff1c,(QString *)0x2a58a3);
      QString::~QString((QString *)0x2a58af);
    }
    QFileInfo::~QFileInfo((QFileInfo *)0x2a58e9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_79);
  }
  __stack_chk_fail();
}

Assistant:

bool
QFile::link(const QString &linkName)
{
    Q_D(QFile);
    if (fileName().isEmpty()) {
        qWarning("QFile::link: Empty or null file name");
        return false;
    }
    QFileInfo fi(linkName);
    if (d->engine()->link(fi.absoluteFilePath())) {
        unsetError();
        return true;
    }
    d->setError(QFile::RenameError, d->fileEngine->errorString());
    return false;
}